

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

C_Node * equality(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  C_Node *tok_00;
  C_Token **ppCVar1;
  _Bool _Var2;
  C_Node *pCVar3;
  C_Token *start;
  C_Node *node;
  C_Token *tok_local;
  C_Token **rest_local;
  C_Parser *parser_local;
  
  node = (C_Node *)tok;
  tok_local = (C_Token *)rest;
  rest_local = (C_Token **)parser;
  start = (C_Token *)relational(parser,(C_Token **)&node,tok);
  while( true ) {
    while( true ) {
      tok_00 = node;
      _Var2 = C_equal((C_Token *)node,"==");
      ppCVar1 = rest_local;
      if (!_Var2) break;
      pCVar3 = relational((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node->next);
      start = (C_Token *)
              new_binary((C_Parser *)ppCVar1,ND_EQ,(C_Node *)start,pCVar3,(C_Token *)tok_00);
    }
    _Var2 = C_equal((C_Token *)node,"!=");
    ppCVar1 = rest_local;
    if (!_Var2) break;
    pCVar3 = relational((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node->next);
    start = (C_Token *)
            new_binary((C_Parser *)ppCVar1,ND_NE,(C_Node *)start,pCVar3,(C_Token *)tok_00);
  }
  *(C_Node **)tok_local = node;
  return (C_Node *)start;
}

Assistant:

static C_Node *equality(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Node *node = relational(parser, &tok, tok);

  for (;;) {
    C_Token *start = tok;

    if (C_equal(tok, "==")) {
      node = new_binary(parser, ND_EQ, node, relational(parser, &tok, tok->next), start);
      continue;
    }

    if (C_equal(tok, "!=")) {
      node = new_binary(parser, ND_NE, node, relational(parser, &tok, tok->next), start);
      continue;
    }

    *rest = tok;
    return node;
  }
}